

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLChTranscoder.cpp
# Opt level: O1

XMLSize_t __thiscall
xercesc_4_0::XMLChTranscoder::transcodeTo
          (XMLChTranscoder *this,XMLCh *srcData,XMLSize_t srcCount,XMLByte *toFill,
          XMLSize_t maxBytes,XMLSize_t *charsEaten,UnRepOpts param_6)

{
  ulong uVar1;
  
  uVar1 = maxBytes >> 1;
  if (srcCount <= maxBytes >> 1) {
    uVar1 = srcCount;
  }
  memcpy(toFill,srcData,uVar1 * 2);
  *charsEaten = uVar1;
  return uVar1 * 2;
}

Assistant:

XMLSize_t
XMLChTranscoder::transcodeTo(const  XMLCh* const    srcData
                            , const XMLSize_t       srcCount
                            ,       XMLByte* const  toFill
                            , const XMLSize_t       maxBytes
                            ,       XMLSize_t&      charsEaten
                                , const UnRepOpts)
{
    //
    //  Calculate the max chars we can do here. Its the lesser of the
    //  max chars we can store in the output byte buffer, and the number
    //  of chars in the source.
    //
    const XMLSize_t maxOutChars  = maxBytes / sizeof(XMLCh);
    const XMLSize_t countToDo    = maxOutChars < srcCount
                                    ? maxOutChars : srcCount;

    //
    //  Copy over the number of chars we calculated. Note that we have
    //  to convert the char count to a byte count!!
    //
    memcpy(toFill, srcData, countToDo * sizeof(XMLCh));

    // Set the chars eaten
    charsEaten = countToDo;

    // Return the bytes we transcoded
    return countToDo * sizeof(XMLCh);
}